

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,cmGeneratorTarget *target,string *lang,bool forceFullPaths,bool forResponseFile,
          string *config)

{
  OutputFormat output;
  cmMakefile *pcVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  ostream *poVar7;
  reference pbVar8;
  char *pcVar9;
  undefined1 *puVar10;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  bool local_471;
  string local_3d0 [8];
  string includePath;
  string local_370;
  undefined1 local_350 [8];
  string frameworkDir;
  string local_328;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  const_iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  bool flagUsed;
  char *sysFwSearchFlag;
  undefined1 local_2a8 [8];
  string sysFwSearchFlagVar;
  char *fwSearchFlag;
  undefined1 local_278 [8];
  string fwSearchFlagVar;
  char *sysIncludeFlag;
  undefined1 local_248 [8];
  string sysFlagVar;
  undefined1 local_220 [6];
  bool repeatFlag;
  byte local_1f9;
  char *pcStack_1f8;
  bool quotePaths;
  char *sep;
  char *includeFlag;
  undefined1 local_1e0 [8];
  string flagVar;
  ostringstream includeFlags;
  OutputFormat shellFormat;
  allocator local_33;
  byte local_32;
  byte local_31;
  bool forResponseFile_local;
  string *psStack_30;
  bool forceFullPaths_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  cmLocalGenerator *this_local;
  string *flags;
  
  local_32 = forResponseFile;
  local_31 = forceFullPaths;
  psStack_30 = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)includes;
  includes_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    output = (local_32 & 1) * 2 + SHELL;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(flagVar.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1e0,"CMAKE_INCLUDE_FLAG_",(allocator *)((long)&includeFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&includeFlag + 7));
    std::__cxx11::string::operator+=((string *)local_1e0,(string *)psStack_30);
    sep = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1e0);
    std::__cxx11::string::operator=((string *)local_1e0,"CMAKE_INCLUDE_FLAG_SEP_");
    std::__cxx11::string::operator+=((string *)local_1e0,(string *)psStack_30);
    pcStack_1f8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_1e0);
    local_1f9 = 0;
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_220,"CMAKE_QUOTE_INCLUDE_PATHS",
               (allocator *)(sysFlagVar.field_2._M_local_buf + 0xf));
    pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::allocator<char>::~allocator((allocator<char> *)(sysFlagVar.field_2._M_local_buf + 0xf));
    if (pcVar6 != (char *)0x0) {
      local_1f9 = 1;
    }
    sysFlagVar.field_2._M_local_buf[0xe] = pcStack_1f8 == (char *)0x0;
    if ((bool)sysFlagVar.field_2._M_local_buf[0xe]) {
      pcStack_1f8 = " ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_248,"CMAKE_INCLUDE_SYSTEM_FLAG_",
               (allocator *)((long)&sysIncludeFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysIncludeFlag + 7));
    std::__cxx11::string::operator+=((string *)local_248,(string *)psStack_30);
    fwSearchFlagVar.field_2._8_8_ = 0;
    if ((sysFlagVar.field_2._M_local_buf[0xe] & 1U) != 0) {
      fwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_248);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_278,"CMAKE_",(allocator *)((long)&fwSearchFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fwSearchFlag + 7));
    std::__cxx11::string::operator+=((string *)local_278,(string *)psStack_30);
    std::__cxx11::string::operator+=((string *)local_278,"_FRAMEWORK_SEARCH_FLAG");
    sysFwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_278)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2a8,"CMAKE_",(allocator *)((long)&sysFwSearchFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysFwSearchFlag + 7));
    std::__cxx11::string::operator+=((string *)local_2a8,(string *)psStack_30);
    std::__cxx11::string::operator+=((string *)local_2a8,"_SYSTEM_FRAMEWORK_SEARCH_FLAG");
    pcVar6 = cmMakefile::GetDefinition(this->Makefile,(string *)local_2a8);
    bVar4 = false;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&i);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_2f8);
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)target_local);
    local_2f8._M_current = local_300;
    while( true ) {
      local_308._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)target_local);
      bVar3 = __gnu_cxx::operator!=(&local_2f8,&local_308);
      if (!bVar3) break;
      frameworkDir.field_2._M_local_buf[0xe] = '\0';
      frameworkDir.field_2._M_local_buf[0xd] = '\0';
      local_471 = false;
      if ((sysFwSearchFlagVar.field_2._8_8_ != 0) &&
         (local_471 = false, *(char *)sysFwSearchFlagVar.field_2._8_8_ != '\0')) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        frameworkDir.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_328,"APPLE",
                   (allocator *)(frameworkDir.field_2._M_local_buf + 0xf));
        frameworkDir.field_2._M_local_buf[0xd] = '\x01';
        bVar3 = cmMakefile::IsOn(pcVar1,&local_328);
        local_471 = false;
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_2f8);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          local_471 = cmSystemTools::IsPathToFramework(pcVar9);
        }
      }
      if ((frameworkDir.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_328);
      }
      if ((frameworkDir.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
      }
      psVar2 = lang_local;
      if (local_471 == false) {
        if ((!bVar4) || ((sysFlagVar.field_2._M_local_buf[0xe] & 1U) != 0)) {
          if ((fwSearchFlagVar.field_2._8_8_ == 0) || (lang_local == (string *)0x0)) {
LAB_005f993d:
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),sep);
          }
          else {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2f8);
            bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory
                              ((cmGeneratorTarget *)psVar2,pbVar8,config);
            if (!bVar4) goto LAB_005f993d;
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),
                            (char *)fwSearchFlagVar.field_2._8_8_);
          }
          bVar4 = true;
        }
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2f8);
        (*this->_vptr_cmLocalGenerator[8])
                  (local_3d0,this,pbVar8,(ulong)output,(ulong)(local_31 & 1));
        if ((((local_1f9 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
           (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_3d0), *pcVar9 != '\"')) {
          std::operator<<((ostream *)((long)&flagVar.field_2 + 8),"\"");
        }
        std::operator<<((ostream *)((long)&flagVar.field_2 + 8),local_3d0);
        if ((((local_1f9 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
           (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_3d0), *pcVar9 != '\"')) {
          std::operator<<((ostream *)((long)&flagVar.field_2 + 8),"\"");
        }
        std::operator<<((ostream *)((long)&flagVar.field_2 + 8),pcStack_1f8);
        std::__cxx11::string::~string(local_3d0);
      }
      else {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2f8);
        std::__cxx11::string::string((string *)local_350,(string *)pbVar8);
        std::__cxx11::string::operator+=((string *)local_350,"/../");
        cmsys::SystemTools::CollapseFullPath(&local_370,(string *)local_350);
        std::__cxx11::string::operator=((string *)local_350,(string *)&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        pVar11 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,(value_type *)local_350);
        psVar2 = lang_local;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if ((pcVar6 == (char *)0x0) || (lang_local == (string *)0x0)) {
LAB_005f980c:
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),
                            (char *)sysFwSearchFlagVar.field_2._8_8_);
          }
          else {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2f8);
            bVar3 = cmGeneratorTarget::IsSystemIncludeDirectory
                              ((cmGeneratorTarget *)psVar2,pbVar8,config);
            if (!bVar3) goto LAB_005f980c;
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),pcVar6);
          }
          cmOutputConverter::ConvertToOutputFormat
                    ((string *)((long)&includePath.field_2 + 8),&this->super_cmOutputConverter,
                     (string *)local_350,output);
          poVar7 = std::operator<<((ostream *)((long)&flagVar.field_2 + 8),
                                   (string *)(includePath.field_2._M_local_buf + 8));
          std::operator<<(poVar7," ");
          std::__cxx11::string::~string((string *)(includePath.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)local_350);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2f8);
    }
    std::__cxx11::ostringstream::str();
    if ((*pcStack_1f8 != ' ') && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      std::__cxx11::string::size();
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      if (*pcVar6 == *pcStack_1f8) {
        std::__cxx11::string::size();
        puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar10 = 0x20;
      }
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(flagVar.field_2._M_local_buf + 8))
    ;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
                                     const std::vector<std::string> &includes,
                                     cmGeneratorTarget* target,
                                     const std::string& lang,
                                     bool forceFullPaths,
                                     bool forResponseFile,
                                     const std::string& config)
{
  if(lang.empty())
    {
    return "";
    }

  OutputFormat shellFormat = forResponseFile? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  const char* includeFlag =
    this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if(this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS"))
    {
    quotePaths = true;
    }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if(!sep)
    {
    sep = " ";
    }
  else
    {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
    }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = 0;
  if(repeatFlag)
    {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
    }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  std::vector<std::string>::const_iterator i;
  for(i = includes.begin(); i != includes.end(); ++i)
    {
    if(fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE")
       && cmSystemTools::IsPathToFramework(i->c_str()))
      {
      std::string frameworkDir = *i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if(emitted.insert(frameworkDir).second)
        {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(*i, config))
          {
          includeFlags << sysFwSearchFlag;
          }
        else
          {
          includeFlags << fwSearchFlag;
          }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
          << " ";
        }
      continue;
      }

    if(!flagUsed || repeatFlag)
      {
      if(sysIncludeFlag && target &&
         target->IsSystemIncludeDirectory(*i, config))
        {
        includeFlags << sysIncludeFlag;
        }
      else
        {
        includeFlags << includeFlag;
        }
      flagUsed = true;
      }
    std::string includePath =
      this->ConvertToIncludeReference(*i, shellFormat, forceFullPaths);
    if(quotePaths && !includePath.empty() && includePath[0] != '\"')
      {
      includeFlags << "\"";
      }
    includeFlags << includePath;
    if(quotePaths && !includePath.empty() && includePath[0] != '\"')
      {
      includeFlags << "\"";
      }
    includeFlags << sep;
    }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if((sep[0] != ' ') && !flags.empty() && flags[flags.size()-1] == sep[0])
    {
    flags[flags.size()-1] = ' ';
    }
  return flags;
}